

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsgpp_unittest.cc
# Opt level: O2

void __thiscall
StunMsgCxx_RFC5769SampleRequestLongTerm_Test::TestBody
          (StunMsgCxx_RFC5769SampleRequestLongTerm_Test *this)

{
  AssertionResult *pAVar1;
  uint16_t uVar2;
  AssertionResult *this_00;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  self_type sVar6;
  msgint local_148;
  AssertHelper local_130;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  iterator i;
  message message;
  char realm [12];
  uint8_t key [16];
  char nonce [29];
  char username [19];
  char password [10];
  uint8_t tsx_id [12];
  
  builtin_strncpy(username,"マトリックス",0x13);
  builtin_strncpy(password,"TheMatrIX",10);
  builtin_strncpy(nonce + 0x10,"oL9FSTvy64sA",0xd);
  builtin_strncpy(nonce,"f//499k954d6OL34",0x10);
  builtin_strncpy(realm,"example.org",0xc);
  tsx_id[0] = 'x';
  tsx_id[1] = 0xad;
  tsx_id[2] = '4';
  tsx_id[3] = '3';
  tsx_id[4] = 0xc6;
  tsx_id[5] = 0xad;
  tsx_id[6] = 'r';
  tsx_id[7] = 0xc0;
  tsx_id[8] = ')';
  tsx_id[9] = 0xda;
  tsx_id[10] = 'A';
  tsx_id[0xb] = '.';
  pcVar3 = (char *)0x9;
  stun_genkey((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)username,0x12,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)realm,0xb,
              password,9,key);
  stun::base_message<std::allocator<unsigned_char>_>::base_message
            ((base_message<std::allocator<unsigned_char>_> *)&message,1,tsx_id);
  strlen(username);
  gtest_ar._0_2_ = 6;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)username;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&message,(varsize<char> *)&gtest_ar);
  strlen(nonce);
  i.attr_.msg_hdr_._0_2_ = 0x15;
  i.attr_.attr_hdr_ = (stun_attr_hdr *)nonce;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&message,(varsize<char> *)&i);
  strlen(realm);
  gtest_ar__1._0_2_ = 0x14;
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)realm;
  stun::base_message<std::allocator<unsigned_char>>::push_back<stun::attribute::bits::varsize<char>>
            ((base_message<std::allocator<unsigned_char>> *)&message,(varsize<char> *)&gtest_ar__1);
  local_148.key_len_ = 0x10;
  local_148.key_ = (uint8_t *)key;
  stun::base_message<std::allocator<unsigned_char>_>::push_back<stun::attribute::bits::msgint>
            (&message,&local_148);
  i.attr_.msg_hdr_ = (stun_msg_hdr *)0x74;
  gtest_ar__1._0_8_ =
       stun_msg_len((stun_msg_hdr *)
                    message.buffer_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"sizeof(expected_result)","message.size()",(unsigned_long *)&i,
             (unsigned_long *)&gtest_ar__1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&i);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x19f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&i);
    pAVar1 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    this_00 = (AssertionResult *)&i;
LAB_0012e920:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_00);
    goto LAB_0012eacb;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  anon_unknown.dwarf_19b63::IsEqual
            ((anon_unknown_dwarf_19b63 *)&i,&DAT_00147480,
             message.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,0x74);
  if ((char)i.attr_.msg_hdr_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&i,
               (AssertionResult *)
               "IsEqual(expected_result, message.data(), sizeof(expected_result))","false","true",
               pcVar3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1a1,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&i.attr_.attr_hdr_);
  i.attr_.msg_hdr_._0_4_ = 1;
  uVar2 = stun_msg_type((stun_msg_hdr *)
                        message.buffer_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  gtest_ar__1._0_2_ = uVar2;
  testing::internal::
  CmpHelperEQ<stun::base_message<std::allocator<unsigned_char>>::type,unsigned_short>
            ((internal *)&gtest_ar,"stun::message::binding_request","message.type()",(type *)&i,
             (unsigned_short *)&gtest_ar__1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&i);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1a5,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&i);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&i);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  i = stun::base_message<std::allocator<unsigned_char>_>::begin(&message);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar5 = i.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
  gtest_ar__1.success_ = !bVar5;
  if (bVar5) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__1,(AssertionResult *)"message.end() != i",
               "false","true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1a8,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
    goto LAB_0012eaaa;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar__1._0_4_ = 6;
  uVar2 = stun_attr_type(i.attr_.attr_hdr_);
  local_148.key_ = (uint8_t *)CONCAT62(local_148.key_._2_6_,uVar2);
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)&gtest_ar,"type::username","i->type()",(attribute_type *)&gtest_ar__1,
             (unsigned_short *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1a9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_148.key_ = (uint8_t *)i.attr_.msg_hdr_;
  local_148.key_len_ = (size_t)i.attr_.attr_hdr_;
  stun::attribute::decoding_bits::string::to_string_abi_cxx11_
            ((string *)&gtest_ar,(string *)&local_148);
  testing::internal::CmpHelperEQ<char[19],std::__cxx11::string>
            ((internal *)&gtest_ar__1,"username","i->to<type::username>().to_string()",&username,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar__1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1ab,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&gtest_ar);
LAB_0012e90c:
    pAVar1 = &gtest_ar__1;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    this_00 = &gtest_ar;
    goto LAB_0012e920;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  sVar6 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar5 = sVar6.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
  gtest_ar__1.success_ = !bVar5;
  if (bVar5) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__1,
               (AssertionResult *)"message.end() != ++i","false","true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1ad,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
    goto LAB_0012eaaa;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar__1._0_4_ = 0x15;
  uVar2 = stun_attr_type(i.attr_.attr_hdr_);
  local_148.key_ = (uint8_t *)CONCAT62(local_148.key_._2_6_,uVar2);
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)&gtest_ar,"type::nonce","i->type()",(attribute_type *)&gtest_ar__1,
             (unsigned_short *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1ae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_148.key_ = (uint8_t *)i.attr_.msg_hdr_;
  local_148.key_len_ = (size_t)i.attr_.attr_hdr_;
  stun::attribute::decoding_bits::string::to_string_abi_cxx11_
            ((string *)&gtest_ar,(string *)&local_148);
  testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
            ((internal *)&gtest_ar__1,"nonce","i->to<type::nonce>().to_string()",&nonce,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar__1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1b0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&gtest_ar);
    goto LAB_0012e90c;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  sVar6 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar5 = sVar6.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
  gtest_ar__1.success_ = !bVar5;
  if (bVar5) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__1,
               (AssertionResult *)"message.end() != ++i","false","true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1b2,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
    goto LAB_0012eaaa;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  gtest_ar__1._0_4_ = 0x14;
  uVar2 = stun_attr_type(i.attr_.attr_hdr_);
  local_148.key_ = (uint8_t *)CONCAT62(local_148.key_._2_6_,uVar2);
  testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
            ((internal *)&gtest_ar,"type::realm","i->type()",(attribute_type *)&gtest_ar__1,
             (unsigned_short *)&local_148);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1b3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_148.key_ = (uint8_t *)i.attr_.msg_hdr_;
  local_148.key_len_ = (size_t)i.attr_.attr_hdr_;
  stun::attribute::decoding_bits::string::to_string_abi_cxx11_
            ((string *)&gtest_ar,(string *)&local_148);
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            ((internal *)&gtest_ar__1,"realm","i->to<type::realm>().to_string()",&realm,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar__1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar__1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar__1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1b5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&gtest_ar);
    goto LAB_0012e90c;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__1.message_);
  sVar6 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
  gtest_ar__1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar5 = sVar6.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
  gtest_ar__1.success_ = !bVar5;
  if (bVar5) {
    testing::Message::Message((Message *)&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar__1,
               (AssertionResult *)"message.end() != ++i","false","true",pcVar3);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
               ,0x1b7,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
LAB_0012eaaa:
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_148);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    gtest_ar__1._0_4_ = 8;
    uVar2 = stun_attr_type(i.attr_.attr_hdr_);
    local_148.key_ = (uint8_t *)CONCAT62(local_148.key_._2_6_,uVar2);
    testing::internal::CmpHelperEQ<stun::attribute::type::attribute_type,unsigned_short>
              ((internal *)&gtest_ar,"type::message_integrity","i->type()",
               (attribute_type *)&gtest_ar__1,(unsigned_short *)&local_148);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1b8,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&gtest_ar__1)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar__1);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar._0_8_ = i.attr_.msg_hdr_;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)i.attr_.attr_hdr_;
    bVar5 = stun::attribute::decoding_bits::msgint::check_integrity<unsigned_char>
                      ((msgint *)&gtest_ar,key,(uchar *)nonce);
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar__1.success_ = bVar5;
    if (!bVar5) {
      testing::Message::Message((Message *)&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                 (AssertionResult *)
                 "i->to<type::message_integrity>().check_integrity(key, key + sizeof(key))","false",
                 "true",pcVar3);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1ba,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_148);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar__1.message_);
    sVar6 = stun::base_message<std::allocator<unsigned_char>_>::iterator::operator++(&i);
    gtest_ar__1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar__1.success_ = sVar6.attr_.attr_hdr_ == (stun_attr_hdr *)0x0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar__1,
                 (AssertionResult *)"message.end() == ++i","false","true",pcVar3);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsgpp_unittest.cc"
                 ,0x1bc,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_148);
      goto LAB_0012eaaa;
    }
  }
  pAVar1 = &gtest_ar__1;
LAB_0012eacb:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&pAVar1->message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&message);
  return;
}

Assistant:

TEST(StunMsgCxx, RFC5769SampleRequestLongTerm) {
  const char username[] =
    "\xE3\x83\x9E\xE3"
    "\x83\x88\xE3\x83"
    "\xAA\xE3\x83\x83"
    "\xE3\x82\xAF\xE3"
    "\x82\xB9";
  const char password[] = "TheMatrIX";
  const char nonce[] = "f//499k954d6OL34oL9FSTvy64sA";
  const char realm[] = "example.org";

  const uint8_t expected_result[] = {
    0x00,0x01,0x00,0x60, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0x78,0xad,0x34,0x33, // }
    0xc6,0xad,0x72,0xc0, // }  Transaction ID
    0x29,0xda,0x41,0x2e, // }
    0x00,0x06,0x00,0x12, //    USERNAME attribute header
    0xe3,0x83,0x9e,0xe3, // }
    0x83,0x88,0xe3,0x83, // }
    0xaa,0xe3,0x83,0x83, // }  Username value (0x18,bytes) and padding (2 bytes)
    0xe3,0x82,0xaf,0xe3, // }
    0x82,0xb9,0x00,0x00, // }
    0x00,0x15,0x00,0x1c, //    NONCE attribute header
    0x66,0x2f,0x2f,0x34, // }
    0x39,0x39,0x6b,0x39, // }
    0x35,0x34,0x64,0x36, // }
    0x4f,0x4c,0x33,0x34, // }  Nonce value
    0x6f,0x4c,0x39,0x46, // }
    0x53,0x54,0x76,0x79, // }
    0x36,0x34,0x73,0x41, // }
    0x00,0x14,0x00,0x0b, //    REALM attribute header
    0x65,0x78,0x61,0x6d, // }
    0x70,0x6c,0x65,0x2e, // }  Realm value (0x11,bytes) and padding (1 byte)
    0x6f,0x72,0x67,0x00, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xf6,0x70,0x24,0x65, // }
    0x6d,0xd6,0x4a,0x3e, // }
    0x02,0xb8,0xe0,0x71, // }  HMAC-SHA1 fingerprint
    0x2e,0x85,0xc9,0xa2, // }
    0x8c,0xa8,0x96,0x66, // }
  };

  uint8_t tsx_id[12] = {
    0x78,0xad,0x34,0x33,
    0xc6,0xad,0x72,0xc0,
    0x29,0xda,0x41,0x2e,
  };

  uint8_t key[16];
  stun_genkey(username, sizeof(username)-1, realm, sizeof(realm)-1,
              password, sizeof(password)-1, key);

  stun::message message(stun::message::binding_request, tsx_id);
  message << stun::attribute::username(username)
          << stun::attribute::nonce(nonce)
          << stun::attribute::realm(realm)
          << stun::attribute::message_integrity(key, sizeof(key));
  ASSERT_EQ(sizeof(expected_result), message.size());
  EXPECT_TRUE(IsEqual(expected_result, message.data(),
      sizeof(expected_result)));

  // Now decoding
  using namespace stun::attribute;
  EXPECT_EQ(stun::message::binding_request, message.type());

  stun::message::iterator i = message.begin();
  ASSERT_TRUE(message.end() != i);
  EXPECT_EQ(type::username, i->type());
  ASSERT_EQ(username,
    i->to<type::username>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::nonce, i->type());
  ASSERT_EQ(nonce,
    i->to<type::nonce>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::realm, i->type());
  ASSERT_EQ(realm,
    i->to<type::realm>().to_string());

  ASSERT_TRUE(message.end() != ++i);
  EXPECT_EQ(type::message_integrity, i->type());
  EXPECT_TRUE(
    i->to<type::message_integrity>().check_integrity(key, key + sizeof(key)));

  ASSERT_TRUE(message.end() == ++i);
}